

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

void __thiscall UniValue::setInt(UniValue *this,int64_t val_)

{
  long in_FS_OFFSET;
  ostringstream oss;
  string in_stack_fffffffffffffe48;
  ostringstream local_198 [376];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<long>((long)local_198);
  std::__cxx11::stringbuf::str();
  setNumStr(this,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::setInt(int64_t val_)
{
    std::ostringstream oss;

    oss << val_;

    return setNumStr(oss.str());
}